

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O1

bool cbtGjkEpaSolver2::Distance
               (cbtConvexShape *shape0,cbtTransform *wtrs0,cbtConvexShape *shape1,
               cbtTransform *wtrs1,cbtVector3 *guess,sResults *results)

{
  float fVar1;
  undefined1 auVar2 [32];
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  _ _Var8;
  code *pcVar9;
  long *plVar10;
  ulong uVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar15 [32];
  undefined1 auVar14 [16];
  undefined1 auVar16 [64];
  undefined1 auVar18 [56];
  undefined1 auVar17 [64];
  undefined1 extraout_var [60];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [12];
  cbtVector3 cVar23;
  tShape shape;
  GJK gjk;
  float local_2bc;
  float local_2b8;
  float local_2b4;
  cbtVector3 local_2a0;
  tShape local_290;
  GJK local_200;
  undefined1 extraout_var_00 [56];
  
  gjkepa2_impl::Initialize(shape0,wtrs0,shape1,wtrs1,results,&local_290,false);
  local_200.m_nfree = 0;
  local_200.m_current = 0;
  local_200.m_ray.m_floats[0] = 0.0;
  local_200.m_ray.m_floats[1] = 0.0;
  local_200.m_ray.m_floats[2] = 0.0;
  local_200.m_ray.m_floats[3] = 0.0;
  local_200.m_status = Failed;
  local_200.m_distance = 0.0;
  _Var8 = gjkepa2_impl::GJK::Evaluate(&local_200,&local_290,guess);
  if (_Var8 == Valid) {
    auVar14 = ZEXT816(0) << 0x40;
    auVar21 = ZEXT1664(auVar14);
    auVar20 = ZEXT1664(ZEXT816(0) << 0x40);
    fVar12 = 0.0;
    auVar13 = ZEXT816(0) << 0x40;
    auVar19 = ZEXT1664(auVar13);
    local_2bc = 0.0;
    local_2b8 = 0.0;
    local_2b4 = 0.0;
    if ((local_200.m_simplex)->rank != 0) {
      local_2b4 = 0.0;
      uVar11 = 0;
      local_2b8 = 0.0;
      local_2bc = 0.0;
      do {
        plVar10 = (long *)((long)&(local_290.m_shapes[0]->super_cbtCollisionShape).
                                  _vptr_cbtCollisionShape + local_290._136_8_);
        pcVar9 = (code *)local_290.Ls;
        if ((local_290.Ls & 1) != 0) {
          pcVar9 = *(code **)(local_290.Ls + *plVar10 + -1);
        }
        fVar1 = (local_200.m_simplex)->p[uVar11];
        auVar22 = (*pcVar9)(plVar10,(local_200.m_simplex)->c[uVar11]);
        auVar16._0_8_ = auVar22._0_8_;
        auVar16._8_56_ = extraout_var_00;
        local_2bc = local_2bc + fVar1 * auVar22._0_4_;
        auVar13 = vmovshdup_avx(auVar16._0_16_);
        local_2b8 = local_2b8 + fVar1 * auVar13._0_4_;
        local_2b4 = local_2b4 + fVar1 * auVar22._8_4_;
        auVar13._0_4_ = -((local_200.m_simplex)->c[uVar11]->d).m_floats[2];
        auVar13._4_4_ = 0x80000000;
        auVar13._8_4_ = 0x80000000;
        auVar13._12_4_ = 0x80000000;
        auVar14._0_8_ =
             *(ulong *)((local_200.m_simplex)->c[uVar11]->d).m_floats ^ 0x8000000080000000;
        auVar14._8_4_ = 0x80000000;
        auVar14._12_4_ = 0x80000000;
        local_2a0.m_floats = (cbtScalar  [4])vinsertps_avx(auVar14,auVar13,0x28);
        auVar18 = ZEXT856(local_2a0.m_floats._8_8_);
        cVar23 = gjkepa2_impl::MinkowskiDiff::Support(&local_290,&local_2a0,1);
        auVar17._0_8_ = cVar23.m_floats._0_8_;
        auVar17._8_56_ = auVar18;
        fVar12 = auVar21._0_4_ + fVar1 * cVar23.m_floats[0];
        auVar21 = ZEXT464((uint)fVar12);
        auVar14 = ZEXT416((uint)fVar12);
        auVar13 = vmovshdup_avx(auVar17._0_16_);
        fVar12 = auVar20._0_4_ + fVar1 * auVar13._0_4_;
        auVar20 = ZEXT464((uint)fVar12);
        fVar1 = auVar19._0_4_ + fVar1 * cVar23.m_floats[2];
        auVar19 = ZEXT464((uint)fVar1);
        auVar13 = ZEXT416((uint)fVar1);
        uVar11 = uVar11 + 1;
      } while (uVar11 < (local_200.m_simplex)->rank);
    }
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(local_2b8 * (wtrs0->m_basis).m_el[0].m_floats[1])),
                             ZEXT416((uint)local_2bc),
                             ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[0]));
    auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)local_2b4),
                             ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[2]));
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(local_2b8 * (wtrs0->m_basis).m_el[1].m_floats[1])),
                             ZEXT416((uint)local_2bc),
                             ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[0]));
    auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)local_2b4),
                             ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[2]));
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(local_2b8 * (wtrs0->m_basis).m_el[2].m_floats[1])),
                             ZEXT416((uint)local_2bc),
                             ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[0]));
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)local_2b4),
                             ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[2]));
    auVar5 = vinsertps_avx(ZEXT416((uint)(auVar5._0_4_ + (wtrs0->m_origin).m_floats[0])),
                           ZEXT416((uint)(auVar6._0_4_ + (wtrs0->m_origin).m_floats[1])),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)(auVar7._0_4_ + (wtrs0->m_origin).m_floats[2])),0x28
                          );
    *(undefined1 (*) [16])results->witnesses[0].m_floats = auVar5;
    auVar5 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (wtrs0->m_basis).m_el[0].m_floats[1])),auVar14,
                             ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[0]));
    auVar5 = vfmadd231ss_fma(auVar5,auVar13,ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[2]));
    auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (wtrs0->m_basis).m_el[1].m_floats[1])),auVar14,
                             ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[0]));
    auVar6 = vfmadd231ss_fma(auVar6,auVar13,ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[2]));
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * (wtrs0->m_basis).m_el[2].m_floats[1])),auVar14,
                             ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[0]));
    auVar7 = vfmadd231ss_fma(auVar7,auVar13,ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[2]));
    auVar5 = vinsertps_avx(ZEXT416((uint)(auVar5._0_4_ + (wtrs0->m_origin).m_floats[0])),
                           ZEXT416((uint)(auVar6._0_4_ + (wtrs0->m_origin).m_floats[1])),0x10);
    auVar14 = vinsertps_avx(ZEXT416((uint)(local_2bc - auVar14._0_4_)),
                            ZEXT416((uint)(local_2b8 - fVar12)),0x10);
    auVar15._16_16_ = auVar14;
    auVar15._0_16_ = auVar5;
    auVar2 = vperm2f128_avx(ZEXT2032(CONCAT416(auVar7._0_4_ + (wtrs0->m_origin).m_floats[2],auVar5))
                            ,ZEXT2032(CONCAT416(local_2b4 - auVar13._0_4_,auVar5)),0x31);
    auVar2 = vunpcklpd_avx(auVar15,auVar2);
    *(undefined1 (*) [32])(results->witnesses + 1) = auVar2;
    fVar12 = (results->normal).m_floats[1];
    auVar13 = ZEXT416((uint)(results->normal).m_floats[0]);
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar12)),auVar13,auVar13);
    auVar14 = ZEXT416((uint)(results->normal).m_floats[2]);
    auVar13 = vfmadd213ss_fma(auVar14,auVar14,auVar13);
    if (auVar13._0_4_ < 0.0) {
      auVar19._0_4_ = sqrtf(auVar13._0_4_);
      auVar19._4_60_ = extraout_var;
      auVar13 = auVar19._0_16_;
    }
    else {
      auVar13 = vsqrtss_avx(auVar13,auVar13);
    }
    results->distance = auVar13._0_4_;
    uVar3 = vcmpss_avx512f(auVar13,ZEXT416(0x38d1b717),0xe);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar12 = (float)((uint)bVar4 * (int)(1.0 / auVar13._0_4_) + (uint)!bVar4 * 0x3f800000);
    (results->normal).m_floats[0] = fVar12 * (results->normal).m_floats[0];
    (results->normal).m_floats[1] = fVar12 * (results->normal).m_floats[1];
    (results->normal).m_floats[2] = fVar12 * (results->normal).m_floats[2];
  }
  else {
    results->status = (_Var8 != Inside) + Penetrating;
  }
  return _Var8 == Valid;
}

Assistant:

bool cbtGjkEpaSolver2::Distance(const cbtConvexShape* shape0,
							   const cbtTransform& wtrs0,
							   const cbtConvexShape* shape1,
							   const cbtTransform& wtrs1,
							   const cbtVector3& guess,
							   sResults& results)
{
	tShape shape;
	Initialize(shape0, wtrs0, shape1, wtrs1, results, shape, false);
	GJK gjk;
	GJK::eStatus::_ gjk_status = gjk.Evaluate(shape, guess);
	if (gjk_status == GJK::eStatus::Valid)
	{
		cbtVector3 w0 = cbtVector3(0, 0, 0);
		cbtVector3 w1 = cbtVector3(0, 0, 0);
		for (U i = 0; i < gjk.m_simplex->rank; ++i)
		{
			const cbtScalar p = gjk.m_simplex->p[i];
			w0 += shape.Support(gjk.m_simplex->c[i]->d, 0) * p;
			w1 += shape.Support(-gjk.m_simplex->c[i]->d, 1) * p;
		}
		results.witnesses[0] = wtrs0 * w0;
		results.witnesses[1] = wtrs0 * w1;
		results.normal = w0 - w1;
		results.distance = results.normal.length();
		results.normal /= results.distance > GJK_MIN_DISTANCE ? results.distance : 1;
		return (true);
	}
	else
	{
		results.status = gjk_status == GJK::eStatus::Inside ? sResults::Penetrating : sResults::GJK_Failed;
		return (false);
	}
}